

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong in_RAX;
  GLFWwindow *handle;
  int iVar1;
  int height;
  int width;
  undefined8 local_28;
  
  local_28 = in_RAX;
  glfwSetErrorCallback(Error);
  glfwInit();
  iVar1 = 0;
  glfwWindowHint(0x20004,0);
  handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    iVar1 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(handle);
    glClearColor(0x3e99999a,0x3dcccccd,0x3e99999a,0x3f800000);
    glfwGetFramebufferSize(handle,(int *)((long)&local_28 + 4),(int *)&local_28);
    glViewport(0,0,local_28._4_4_,local_28 & 0xffffffff);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0xbff0000000000000,0x3ff0000000000000,0,0,0xbfe0000000000000,0x408f400000000000);
    glMatrixMode(0x1700);
    glClear(0x4000);
    glBegin(4);
    glColor3f(0x3f4ccccd,0,0);
    glVertex3f(0xbf666666,0xbf666666,0xc1f00000);
    glColor3f(0,0x3f666666,0);
    glVertex3f(0x3f666666,0xbf666666,0xc1f00000);
    glColor3f(0,0,0x3f333333);
    glVertex3f(0,0x3f666666,0xc1f00000);
    glEnd();
    glFlush();
    glfwSwapBuffers(handle);
    glfwDestroyWindow(handle);
    glfwTerminate();
  }
  return iVar1;
}

Assistant:

int
main(int argc, char **argv)
{
   glfwSetErrorCallback(&Error);

   glfwInit();

   glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

   window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
   if (!window) {
      return EXIT_SKIP;
   }

   glfwMakeContextCurrent(window);

   Init();
   Reshape();
   Draw();

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}